

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O2

int __thiscall SingleFile::GetType(SingleFile *this)

{
  ITypeManager *pIVar1;
  int iVar2;
  string local_40 [32];
  
  pIVar1 = (this->super_IContainedElement).type_manager_;
  iVar2 = (*pIVar1->_vptr_ITypeManager[1])(pIVar1,this->buffer_,(ulong)(uint)this->buffer_size_);
  if (iVar2 == 0) {
    pIVar1 = (this->super_IContainedElement).type_manager_;
    std::__cxx11::string::string(local_40,(string *)&this->file_name_);
    iVar2 = (**pIVar1->_vptr_ITypeManager)(pIVar1,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return iVar2;
}

Assistant:

int SingleFile::GetType()
{
   // Check from buffer
   int type = type_manager_->GetTypeFromBuffer(buffer_, buffer_size_);
   if (type == 0)
      return type_manager_->GetTypeFromFile(file_name_);
   return type;
}